

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O2

int __thiscall
MODEL3D::three_dim_model::generate_non_fill_layer
          (three_dim_model *this,int *layer_number,int *mask_type)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pvVar1;
  double dVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  bool *has_holes;
  iterator pos_it;
  double dVar5;
  pointer __x;
  double delta;
  double delta_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_338;
  Paths solution_paths;
  Paths secondary_paths;
  string local_2d8;
  Paths primary_paths;
  Paths positives;
  ClipperOffset co;
  Clipper my_mask;
  
  pmVar3 = std::
           map<int,_std::vector<GEO::point,_std::allocator<GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>_>_>
           ::operator[](&this->etch_contour_map,layer_number);
  delta = round((pmVar3->super__Vector_base<GEO::point,_std::allocator<GEO::point>_>)._M_impl.
                super__Vector_impl_data._M_finish[-1].x * 1.4);
  delta_00 = round(delta / -10.0);
  positives.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  positives.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  positives.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  my_mask._vptr_Clipper._0_4_ = *layer_number;
  pmVar4 = std::
           map<unsigned_int,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>_>_>
           ::operator[](&this->clipper_polygons_map,(key_type_conflict *)&my_mask);
  pvVar1 = (pmVar4->
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  my_mask._vptr_Clipper._0_4_ = *layer_number;
  pmVar4 = std::
           map<unsigned_int,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>_>_>
           ::operator[](&this->clipper_polygons_map,(key_type_conflict *)&my_mask);
  for (__x = (pmVar4->
             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start; __x != pvVar1; __x = __x + 1) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
              ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&my_mask,__x);
    co.MiterLimit = 0.0;
    co.ArcTolerance = 0.0;
    co.m_destPolys.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ClipperLib::SimplifyPolygon((Path *)&my_mask,(Paths *)&co,pftNonZero);
    dVar2 = co.ArcTolerance;
    dVar5 = co.MiterLimit;
    if (co.ArcTolerance != co.MiterLimit) {
      for (; dVar5 != dVar2; dVar5 = (double)((long)dVar5 + 0x18)) {
        std::
        vector<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>,std::allocator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
        ::
        insert<__gnu_cxx::__normal_iterator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>*,std::vector<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>,std::allocator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>>,void>
                  ((vector<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>,std::allocator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
                    *)&positives,
                   (const_iterator)
                   positives.
                   super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                    )co.MiterLimit,
                   (__normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                    )co.ArcTolerance);
      }
    }
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::~vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               *)&co);
    std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~_Vector_base
              ((_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)&my_mask
              );
  }
  ClipperLib::Clipper::Clipper(&my_mask,0);
  solution_paths.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  solution_paths.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  solution_paths.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ClipperLib::ClipperOffset::ClipperOffset(&co,2.0,0.25);
  ClipperLib::ClipperOffset::Clear(&co);
  ClipperLib::ClipperOffset::AddPaths(&co,&positives,jtMiter,etClosedPolygon);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::clear(&solution_paths);
  ClipperLib::ClipperOffset::Execute(&co,&solution_paths,delta_00);
  ClipperLib::ClipperOffset::Clear(&co);
  ClipperLib::ClipperOffset::AddPaths(&co,&solution_paths,jtMiter,etClosedPolygon);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::clear(&solution_paths);
  ClipperLib::ClipperOffset::Execute(&co,&solution_paths,delta);
  ClipperLib::ClipperOffset::Clear(&co);
  has_holes = (bool *)0x0;
  ClipperLib::ClipperOffset::AddPaths
            (&co,&solution_paths,jtMiter - this->round_concave_corners,etClosedPolygon);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::clear(&solution_paths);
  ClipperLib::ClipperOffset::Execute(&co,&solution_paths,-delta);
  primary_paths.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  primary_paths.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  primary_paths.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  secondary_paths.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  secondary_paths.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  secondary_paths.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::operator=(&primary_paths,&solution_paths);
  filter_paths(this,&primary_paths,&secondary_paths);
  tidy_paths(this,&primary_paths);
  tidy_paths(this,&secondary_paths);
  repair_circles(this,&primary_paths);
  repair_circles(this,&secondary_paths);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_338,"",(allocator<char> *)&local_2d8);
  this_00 = &this->py_script;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             &bStack_338);
  std::__cxx11::string::~string((string *)&bStack_338);
  std::__cxx11::to_string(&local_2d8,*layer_number);
  std::operator+(&bStack_338,"    # Layer ",&local_2d8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             &bStack_338);
  std::__cxx11::string::~string((string *)&bStack_338);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::to_string(&local_2d8,*layer_number);
  std::operator+(&bStack_338,"    current_layer =  ",&local_2d8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             &bStack_338);
  std::__cxx11::string::~string((string *)&bStack_338);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_338,"    print(f\'Generating Layer {current_layer}.\')",
             (allocator<char> *)&local_2d8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             &bStack_338);
  std::__cxx11::string::~string((string *)&bStack_338);
  generate_freecad_solid(this,&primary_paths,&secondary_paths,has_holes,layer_number,mask_type);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector(&secondary_paths);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector(&primary_paths);
  ClipperLib::ClipperOffset::~ClipperOffset(&co);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector(&solution_paths);
  ClipperLib::Clipper::~Clipper(&my_mask);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector(&positives);
  return 0;
}

Assistant:

int MODEL3D::three_dim_model::generate_non_fill_layer(const int &layer_number, const int &mask_type)
{
    double cont_wid = std::prev(etch_contour_map[layer_number].end(),1)->x;
    double countour_width = std::round(cont_wid*1.4);//40% tolerance to avoid bunching
    double foot_adjustment = std::round(-(countour_width/10));
    ClipperLib::Paths positives;
    auto poly_end = clipper_polygons_map[layer_number].end();
    // For each polygon on this layer.
    for (   auto poly_it = clipper_polygons_map[layer_number].begin();
            poly_it != poly_end; poly_it++)
    {
        ClipperLib::Path my_path = *poly_it;
        ClipperLib::Paths positive;
        ClipperLib::SimplifyPolygon(my_path, positive, ClipperLib::pftNonZero);
        if(positive.size()>0)
        {
            auto pos_end = positive.end();
            for (auto pos_it = positive.begin(); pos_it != pos_end; pos_it++)
            {
                positives.insert(positives.end(),positive.begin(),positive.end());
            }
        }
    }
    ClipperLib::Clipper my_mask;
    ClipperLib::Paths solution_paths;
    ClipperLib::ClipperOffset co;
    // shift by foot adjustment
    co.Clear();
    co.AddPaths(positives, ClipperLib::jtMiter, ClipperLib::etClosedPolygon);
    solution_paths.clear();
    co.Execute(solution_paths, foot_adjustment);
    // grow by contour width
    co.Clear();
    co.AddPaths(solution_paths, ClipperLib::jtMiter, ClipperLib::etClosedPolygon);
    solution_paths.clear();
    co.Execute(solution_paths, countour_width);
    // reduce by contour width (creates correct contour profile)
    co.Clear();
    if(round_concave_corners==true)
        co.AddPaths(solution_paths, ClipperLib::jtRound, ClipperLib::etClosedPolygon);
    else
        co.AddPaths(solution_paths, ClipperLib::jtMiter, ClipperLib::etClosedPolygon);
    solution_paths.clear();
    // co.ArcTolerance = 0.25;
    co.Execute(solution_paths, -countour_width);
    // filter into primary and secondary shapes
    ClipperLib::Paths primary_paths, secondary_paths;
    primary_paths = solution_paths;
    bool has_holes = filter_paths(primary_paths, secondary_paths);
    tidy_paths(primary_paths);
    tidy_paths(secondary_paths);
    repair_circles(primary_paths);
    repair_circles(secondary_paths);
    py_script.push_back("");
    py_script.push_back("    # Layer " + std::to_string(layer_number) );
    py_script.push_back("    current_layer =  " + std::to_string(layer_number) );
    py_script.push_back("    print(f'Generating Layer {current_layer}.')");
    generate_freecad_solid(primary_paths, secondary_paths, has_holes, layer_number, mask_type);
    // if (primary_paths.size()>0)
    //     clipper_paths_to_gds(primary_paths, "Primary_paths", layer_number);
    // if (secondary_paths.size()>0)
    //     clipper_paths_to_gds(secondary_paths, "Secondary_paths", layer_number);
    return EXIT_SUCCESS;
}